

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_resampler_init_preallocated
                    (ma_resampler_config *pConfig,void *pHeap,ma_resampler *pResampler)

{
  ma_resampling_backend_vtable **ppmVar1;
  _func_ma_result_void_ptr_ma_resampler_config_ptr_void_ptr_ma_resampling_backend_ptr_ptr
  *UNRECOVERED_JUMPTABLE;
  bool bVar2;
  ma_uint32 mVar3;
  ma_uint32 mVar4;
  ma_uint32 mVar5;
  ma_result mVar6;
  ma_resampler *pmVar7;
  
  if (pResampler == (ma_resampler *)0x0) {
    return MA_INVALID_ARGS;
  }
  memset(pResampler,0,0xc0);
  if (pConfig == (ma_resampler_config *)0x0) {
    return MA_INVALID_ARGS;
  }
  pResampler->_pHeap = pHeap;
  mVar3 = pConfig->channels;
  mVar4 = pConfig->sampleRateIn;
  mVar5 = pConfig->sampleRateOut;
  pResampler->format = pConfig->format;
  pResampler->channels = mVar3;
  pResampler->sampleRateIn = mVar4;
  pResampler->sampleRateOut = mVar5;
  ppmVar1 = &pResampler->pBackendVTable;
  pResampler->pBackendVTable = (ma_resampling_backend_vtable *)0x0;
  pResampler->pBackendUserData = (void *)0x0;
  if (pConfig->algorithm == ma_resample_algorithm_custom) {
    *ppmVar1 = pConfig->pBackendVTable;
    pmVar7 = (ma_resampler *)pConfig->pBackendUserData;
  }
  else {
    if (pConfig->algorithm != ma_resample_algorithm_linear) {
      mVar6 = MA_INVALID_ARGS;
      bVar2 = false;
      goto LAB_00141e0c;
    }
    *ppmVar1 = &g_ma_linear_resampler_vtable;
    pmVar7 = pResampler;
  }
  pResampler->pBackendUserData = pmVar7;
  mVar6 = MA_SUCCESS;
  bVar2 = true;
LAB_00141e0c:
  if (bVar2) {
    mVar6 = MA_NOT_IMPLEMENTED;
    if ((*ppmVar1 != (ma_resampling_backend_vtable *)0x0) &&
       (UNRECOVERED_JUMPTABLE = (*ppmVar1)->onInit,
       UNRECOVERED_JUMPTABLE !=
       (_func_ma_result_void_ptr_ma_resampler_config_ptr_void_ptr_ma_resampling_backend_ptr_ptr *)
       0x0)) {
      mVar6 = (*UNRECOVERED_JUMPTABLE)
                        (pResampler->pBackendUserData,pConfig,pHeap,&pResampler->pBackend);
      return mVar6;
    }
  }
  return mVar6;
}

Assistant:

MA_API ma_result ma_resampler_init_preallocated(const ma_resampler_config* pConfig, void* pHeap, ma_resampler* pResampler)
{
    ma_result result;

    if (pResampler == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pResampler);

    if (pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    pResampler->_pHeap        = pHeap;
    pResampler->format        = pConfig->format;
    pResampler->channels      = pConfig->channels;
    pResampler->sampleRateIn  = pConfig->sampleRateIn;
    pResampler->sampleRateOut = pConfig->sampleRateOut;

    result = ma_resampler_get_vtable(pConfig, pResampler, &pResampler->pBackendVTable, &pResampler->pBackendUserData);
    if (result != MA_SUCCESS) {
        return result;
    }

    if (pResampler->pBackendVTable == NULL || pResampler->pBackendVTable->onInit == NULL) {
        return MA_NOT_IMPLEMENTED;  /* onInit not implemented. */
    }

    result = pResampler->pBackendVTable->onInit(pResampler->pBackendUserData, pConfig, pHeap, &pResampler->pBackend);
    if (result != MA_SUCCESS) {
        return result;
    }

    return MA_SUCCESS;
}